

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS
ref_grid_compact_surf_id_nodes
          (REF_GRID ref_grid,REF_INT cell_id,REF_GLOB *nnode_global,REF_LONG *ncell_global,
          REF_GLOB **l2c)

{
  size_t __size;
  int iVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  REF_MPI pRVar3;
  bool bVar4;
  long *plVar5;
  REF_STATUS RVar6;
  uint uVar7;
  int iVar8;
  REF_GLOB *pRVar9;
  void *array;
  long lVar10;
  REF_INT cell;
  long lVar11;
  REF_CELL *ppRVar12;
  long lVar13;
  REF_INT nnode;
  REF_INT part;
  REF_INT nodes [27];
  uint local_ec;
  int local_e4;
  REF_MPI local_e0;
  int local_d4;
  REF_NODE local_d0;
  int local_c4;
  long *local_c0;
  long *local_b8;
  REF_CELL *local_b0;
  REF_INT local_a8 [30];
  
  local_e0 = ref_grid->mpi;
  local_d0 = ref_grid->node;
  iVar8 = local_d0->max;
  local_c0 = ncell_global;
  if ((long)iVar8 < 0) {
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x25f,
           "ref_grid_compact_surf_id_nodes","malloc *l2c of REF_GLOB negative");
    local_ec = 1;
  }
  else {
    __size = (long)iVar8 * 8;
    pRVar9 = (REF_GLOB *)malloc(__size);
    *l2c = pRVar9;
    if (pRVar9 == (REF_GLOB *)0x0) {
      bVar4 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x25f,
             "ref_grid_compact_surf_id_nodes","malloc *l2c of REF_GLOB NULL");
      local_ec = 2;
    }
    else {
      bVar4 = true;
      if (iVar8 != 0) {
        memset(pRVar9,0xff,__size);
      }
    }
  }
  if (bVar4) {
    *nnode_global = 0;
    *local_c0 = 0;
    local_e4 = 0;
    local_b0 = ref_grid->cell;
    ppRVar12 = ref_grid->cell + 3;
    lVar13 = 3;
    local_d4 = 0;
    local_b8 = nnode_global;
    do {
      ref_cell = *ppRVar12;
      if (0 < ref_cell->max) {
        cell = 0;
        do {
          RVar6 = ref_cell_nodes(ref_cell,cell,local_a8);
          if ((RVar6 == 0) && (local_a8[ref_cell->node_per] == cell_id)) {
            uVar7 = ref_cell_part(ref_cell,local_d0,cell,&local_c4);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x269,"ref_grid_compact_surf_id_nodes",(ulong)uVar7,"part");
              return uVar7;
            }
            local_d4 = local_d4 + (uint)(local_e0->id == local_c4);
            if (0 < ref_cell->node_per) {
              pRVar2 = local_d0->part;
              pRVar3 = local_d0->ref_mpi;
              lVar11 = 0;
              iVar8 = local_e4;
              do {
                iVar1 = local_a8[lVar11];
                if ((pRVar3->id == pRVar2[iVar1]) && ((*l2c)[iVar1] == -1)) {
                  (*l2c)[iVar1] = (long)iVar8;
                  iVar8 = iVar8 + 1;
                  local_e4 = iVar8;
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < ref_cell->node_per);
            }
          }
          cell = cell + 1;
        } while (cell < ref_cell->max);
      }
      ppRVar12 = local_b0 + lVar13 + 1;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 8);
    *local_c0 = (long)local_d4;
    local_ec = ref_mpi_allsum(local_e0,local_c0,1,2);
    plVar5 = local_b8;
    if (local_ec == 0) {
      if ((long)local_e0->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x27b,"ref_grid_compact_surf_id_nodes","malloc counts of REF_INT negative");
        local_ec = 1;
      }
      else {
        array = malloc((long)local_e0->n << 2);
        if (array == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x27b,"ref_grid_compact_surf_id_nodes","malloc counts of REF_INT NULL");
          local_ec = 2;
        }
        else {
          local_ec = ref_mpi_allgather(local_e0,&local_e4,array,1);
          if (local_ec == 0) {
            lVar13 = 0;
            if (0 < (long)local_e0->id) {
              lVar11 = 0;
              do {
                lVar13 = (long)(int)lVar13 + (long)*(int *)((long)array + lVar11 * 4);
                lVar11 = lVar11 + 1;
              } while (local_e0->id != lVar11);
            }
            if (0 < (long)local_e0->n) {
              lVar11 = *plVar5;
              lVar10 = 0;
              do {
                lVar11 = lVar11 + *(int *)((long)array + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (local_e0->n != lVar10);
              *plVar5 = lVar11;
            }
            free(array);
            iVar8 = local_d0->max;
            if (0 < (long)iVar8) {
              pRVar9 = *l2c;
              lVar11 = 0;
              do {
                lVar10 = pRVar9[lVar11];
                if (lVar10 != -1) {
                  pRVar9[lVar11] = lVar10 + lVar13;
                }
                lVar11 = lVar11 + 1;
              } while (iVar8 != lVar11);
            }
            local_ec = ref_node_ghost_glob(local_d0,*l2c,1);
            if (local_ec == 0) {
              local_ec = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x28a,"ref_grid_compact_surf_id_nodes",(ulong)local_ec,"xfer");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x27c,"ref_grid_compact_surf_id_nodes",(ulong)local_ec,"gather size");
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x279,
             "ref_grid_compact_surf_id_nodes",(ulong)local_ec,"allsum");
    }
  }
  return local_ec;
}

Assistant:

REF_FCN REF_STATUS ref_grid_compact_surf_id_nodes(REF_GRID ref_grid,
                                                  REF_INT cell_id,
                                                  REF_GLOB *nnode_global,
                                                  REF_LONG *ncell_global,
                                                  REF_GLOB **l2c) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT cell, node, cell_node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_INT offset, group;
  REF_CELL ref_cell;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_grid_2d_ref_cell(ref_grid, group,
                            ref_cell){each_ref_cell_valid_cell_with_nodes(
      ref_cell, cell, nodes){if (cell_id == nodes[ref_cell_id_index(ref_cell)]){
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
  if (ref_mpi_rank(ref_mpi) == part) {
    ncell++;
  }
  each_ref_cell_cell_node(ref_cell, cell_node) {
    if (ref_node_owned(ref_node, nodes[cell_node]) &&
        (REF_EMPTY == (*l2c)[nodes[cell_node]])) {
      (*l2c)[nodes[cell_node]] = nnode;
      nnode++;
    }
  }
}
}
}

(*ncell_global) = ncell;
RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
offset = 0;
for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
  offset += counts[proc];
}
each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }